

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

void __thiscall Fl_Return_Button_Type::ideal_size(Fl_Return_Button_Type *this,int *w,int *h)

{
  int iVar1;
  Fl_Fontsize FVar2;
  int local_24;
  int W;
  int *h_local;
  int *w_local;
  Fl_Return_Button_Type *this_local;
  
  Fl_Button_Type::ideal_size(&this->super_Fl_Button_Type,w,h);
  local_24 = Fl_Widget::h((this->super_Fl_Button_Type).super_Fl_Widget_Type.o);
  iVar1 = Fl_Widget::w((this->super_Fl_Button_Type).super_Fl_Widget_Type.o);
  if (iVar1 / 3 < local_24) {
    local_24 = Fl_Widget::w((this->super_Fl_Button_Type).super_Fl_Widget_Type.o);
    local_24 = local_24 / 3;
  }
  FVar2 = Fl_Widget::labelsize((this->super_Fl_Button_Type).super_Fl_Widget_Type.o);
  *w = ((local_24 + 8) - FVar2) + *w;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Button_Type::ideal_size(w, h);
    int W = o->h();
    if (o->w()/3 < W) W = o->w()/3;
    w += W + 8 - o->labelsize();
  }